

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O1

int xmlParseUriOrPath(char *str,xmlURIPtr *out,int *drive)

{
  int iVar1;
  xmlURIPtr uri;
  xmlChar *pxVar2;
  char *path;
  size_t sVar3;
  char *__dest;
  
  *out = (xmlURIPtr)0x0;
  *drive = 0;
  uri = (xmlURIPtr)(*xmlMalloc)(0x58);
  if (uri == (xmlURIPtr)0x0) {
    uri = (xmlURIPtr)0x0;
  }
  else {
    uri->fragment = (char *)0x0;
    *(undefined8 *)&uri->cleanup = 0;
    uri->path = (char *)0x0;
    uri->query = (char *)0x0;
    uri->user = (char *)0x0;
    *(undefined8 *)&uri->port = 0;
    uri->authority = (char *)0x0;
    uri->server = (char *)0x0;
    uri->scheme = (char *)0x0;
    uri->opaque = (char *)0x0;
    uri->query_raw = (char *)0x0;
  }
  iVar1 = -1;
  if (uri == (xmlURIPtr)0x0) {
    path = (char *)0x0;
  }
  else {
    pxVar2 = xmlStrstr((xmlChar *)str,"://");
    if (pxVar2 == (xmlChar *)0x0) {
      path = (*xmlMemStrdup)(str);
      if (path == (char *)0x0) goto LAB_001539c1;
      xmlNormalizePath(path,1);
      sVar3 = strlen(path);
      __dest = (char *)(*xmlMalloc)(sVar3 + 1);
      uri->path = __dest;
      if (__dest == (char *)0x0) goto LAB_001539c1;
      memcpy(__dest,path,sVar3 + 1);
    }
    else {
      iVar1 = xmlParse3986URIReference(uri,str);
      if (iVar1 != 0) {
        path = (char *)0x0;
        goto LAB_001539c1;
      }
      path = (char *)0x0;
      xmlNormalizePath(uri->path,0);
    }
    *out = uri;
    iVar1 = 0;
  }
  uri = (xmlURIPtr)0x0;
LAB_001539c1:
  xmlFreeURI(uri);
  (*xmlFree)(path);
  return iVar1;
}

Assistant:

static int
xmlParseUriOrPath(const char *str, xmlURIPtr *out, int *drive) {
    xmlURIPtr uri;
    char *buf = NULL;
    int ret;

    *out = NULL;
    *drive = 0;

    uri = xmlCreateURI();
    if (uri == NULL) {
        ret = -1;
	goto done;
    }

    if (xmlStrstr(BAD_CAST str, BAD_CAST "://") == NULL) {
        const char *path;
        size_t pathSize;
        int prependSlash = 0;

        buf = xmlMemStrdup(str);
        if (buf == NULL) {
            ret = -1;
            goto done;
        }
        xmlNormalizePath(buf, /* isFile */ 1);

        path = buf;

        if (xmlIsAbsolutePath(BAD_CAST buf)) {
#if defined(_WIN32) || defined(__CYGWIN__)
            const char *server = NULL;
            int isFileScheme = 0;
#endif

#if defined(_WIN32) || defined(__CYGWIN__)
            if (strncmp(buf, "//?/UNC/", 8) == 0) {
                server = buf + 8;
                isFileScheme = 1;
            } else if (strncmp(buf, "//?/", 4) == 0) {
                path = buf + 3;
                isFileScheme = 1;
            } else if (strncmp(buf, "//", 2) == 0) {
                server = buf + 2;
                isFileScheme = 1;
            }

            if (server != NULL) {
                const char *end = strchr(server, '/');

                if (end == NULL) {
                    uri->server = xmlMemStrdup(server);
                    path = "/";
                } else {
                    uri->server = (char *) xmlStrndup(BAD_CAST server,
                                                      end - server);
                    path = end;
                }
                if (uri->server == NULL) {
                    ret = -1;
                    goto done;
                }
            }

            if ((((path[0] >= 'A') && (path[0] <= 'Z')) ||
                 ((path[0] >= 'a') && (path[0] <= 'z'))) &&
                (path[1] == ':')) {
                prependSlash = 1;
                isFileScheme = 1;
            }

            if (isFileScheme) {
                uri->scheme = xmlMemStrdup("file");
                if (uri->scheme == NULL) {
                    ret = -1;
                    goto done;
                }

                if (uri->server == NULL)
                    uri->port = PORT_EMPTY_SERVER;
            }
#endif
        }

        pathSize = strlen(path);
        uri->path = xmlMalloc(pathSize + prependSlash + 1);
        if (uri->path == NULL) {
            ret = -1;
            goto done;
        }
        if (prependSlash) {
            uri->path[0] = '/';
            memcpy(uri->path + 1, path, pathSize + 1);
        } else {
            memcpy(uri->path, path, pathSize + 1);
        }
    } else {
	ret = xmlParseURIReference(uri, str);
	if (ret != 0)
	    goto done;

        xmlNormalizePath(uri->path, /* isFile */ 0);
    }

#if defined(_WIN32) || defined(__CYGWIN__)
    if ((uri->path[0] == '/') &&
        (((uri->path[1] >= 'A') && (uri->path[1] <= 'Z')) ||
         ((uri->path[1] >= 'a') && (uri->path[1] <= 'z'))) &&
        (uri->path[2] == ':'))
        *drive = uri->path[1];
#endif

    *out = uri;
    uri = NULL;
    ret = 0;

done:
    xmlFreeURI(uri);
    xmlFree(buf);

    return(ret);
}